

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::start(QProcess *this,OpenMode mode)

{
  long lVar1;
  bool bVar2;
  QProcessPrivate *s;
  long in_FS_OFFSET;
  QProcessPrivate *d;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  QProcessPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s = d_func((QProcess *)0x792192);
  if (s->processState == '\0') {
    bVar2 = QString::isEmpty((QString *)0x7921e4);
    if (bVar2) {
      uVar3 = 0;
      tr((char *)s,(char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
         in_stack_ffffffffffffff6c);
      QProcessPrivate::setErrorAndEmit
                ((QProcessPrivate *)CONCAT44(uVar3,in_stack_ffffffffffffff80),
                 (ProcessError)((ulong)s >> 0x20),
                 (QString *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      QString::~QString((QString *)0x792236);
    }
    else {
      QProcessPrivate::start(in_stack_ffffffffffffffe0,d._4_4_);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffd0,
               "QProcess::start: Process is already running");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::start(OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return;
    }
    if (d->program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return;
    }

    d->start(mode);
}